

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_2::detail::
concat<std::__cxx11::string,char_const(&)[26],std::__cxx11::string,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char (*args) [26],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,char *args_2)

{
  char *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [26];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  concat_length<std::__cxx11::string,char>
            ((char *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char *)args_1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[26],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (__return_storage_ptr__,(char (*) [26])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char *)args_1);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(std::forward<Args>(args)...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}